

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::HelpFileName(string *__return_storage_ptr__,string *name)

{
  string *name_local;
  
  cmsys::SystemTools::ReplaceString(name,"<","");
  cmsys::SystemTools::ReplaceString(name,">","");
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::HelpFileName(std::string name)
{
  cmSystemTools::ReplaceString(name, "<", "");
  cmSystemTools::ReplaceString(name, ">", "");
  return name;
}